

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O3

double __thiscall cali::StringConverter::to_double(StringConverter *this,bool *okptr)

{
  int iVar1;
  char *__nptr;
  bool bVar2;
  int *piVar3;
  undefined8 uVar4;
  double dVar5;
  char *local_30;
  
  __nptr = (this->m_str)._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  dVar5 = strtod(__nptr,&local_30);
  if (local_30 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stod");
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    __cxa_begin_catch(uVar4);
    __cxa_end_catch();
    dVar5 = 0.0;
    bVar2 = false;
    goto LAB_0018f77b;
  }
  if (*piVar3 == 0) {
LAB_0018f776:
    *piVar3 = iVar1;
  }
  else if (*piVar3 == 0x22) {
    dVar5 = (double)std::__throw_out_of_range("stod");
    goto LAB_0018f776;
  }
  bVar2 = true;
LAB_0018f77b:
  if (okptr != (bool *)0x0) {
    *okptr = bVar2;
  }
  return dVar5;
}

Assistant:

double cali::StringConverter::to_double(bool* okptr) const
{
    bool   ok  = false;
    double res = 0;

    try {
        res = std::stod(m_str);
        ok  = true;
    } catch (...) {
        ok = false;
    }

    if (okptr)
        *okptr = ok;

    return res;
}